

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_krp.c
# Opt level: O0

err_t beltKRP(octet *dest,size_t m,octet *src,size_t n,octet *level,octet *header)

{
  bool_t bVar1;
  blob_t len;
  ulong in_RCX;
  octet *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  octet *in_R8;
  octet *in_R9;
  void *state;
  octet *in_stack_ffffffffffffffb8;
  
  if ((((in_RSI <= in_RCX) && (((in_RSI == 0x10 || (in_RSI == 0x18)) || (in_RSI == 0x20)))) &&
      ((((in_RCX == 0x10 || (in_RCX == 0x18)) || (in_RCX == 0x20)) &&
       ((bVar1 = memIsValid(in_RDX,in_RCX), bVar1 != 0 &&
        (bVar1 = memIsValid(in_R8,0xc), bVar1 != 0)))))) &&
     ((bVar1 = memIsValid(in_R9,0x10), bVar1 != 0 && (bVar1 = memIsValid(in_RDI,in_RSI), bVar1 != 0)
      ))) {
    beltKRP_keep();
    len = blobCreate((size_t)in_stack_ffffffffffffffb8);
    if (len == (blob_t)0x0) {
      return 0x6e;
    }
    beltKRPStart(in_R8,in_R9,(size_t)len,in_stack_ffffffffffffffb8);
    beltKRPStepG(in_RDX,in_RCX,in_R8,in_R9);
    blobClose((blob_t)0x15c64c);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltKRP(octet dest[], size_t m, const octet src[], size_t n,
	const octet level[12], const octet header[16])
{
	void* state;
	// проверить входные данные
	if (m > n ||
		m != 16 && m != 24 && m != 32 ||
		n != 16 && n != 24 && n != 32 ||
		!memIsValid(src, n) ||
		!memIsValid(level, 12) ||
		!memIsValid(header, 16) ||
		!memIsValid(dest, m))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltKRP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// преобразовать ключ
	beltKRPStart(state, src, n, level);
	beltKRPStepG(dest, m, header, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}